

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_writers.h
# Opt level: O1

void __thiscall cppwinrt::writer::save_header(writer *this,char impl)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> filename;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,settings._96_8_,settings._104_8_ + settings._96_8_);
  std::__cxx11::string::append((char *)&local_40);
  if (impl != '\0') {
    std::__cxx11::string::append((char *)&local_40);
  }
  std::__cxx11::string::_M_append((char *)&local_40,(ulong)(this->type_namespace)._M_dataplus._M_p);
  if (impl != '\0') {
    std::__cxx11::string::push_back((char)&local_40);
    std::__cxx11::string::push_back((char)&local_40);
  }
  std::__cxx11::string::append((char *)&local_40);
  writer_base<cppwinrt::writer>::flush_to_file(&this->super_writer_base<cppwinrt::writer>,&local_40)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void save_header(char impl = 0)
        {
            auto filename{ settings.output_folder + "winrt/" };

            if (impl)
            {
                filename += "impl/";
            }

            filename += type_namespace;

            if (impl)
            {
                filename += '.';
                filename += impl;
            }

            filename += ".h";
            flush_to_file(filename);
        }